

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Any::
Any<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&,void>
          (Any *this,shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *t_value)

{
  Data *in_RAX;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  std::
  make_unique<chaiscript::detail::Any::Data_Impl<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>const&>
            ((shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base> *)&local_18);
  (this->m_data)._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       local_18._M_head_impl;
  return;
}

Assistant:

explicit Any(ValueType &&t_value)
          : m_data(std::make_unique<Data_Impl<std::decay_t<ValueType>>>(std::forward<ValueType>(t_value))) {
      }